

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O1

void __thiscall chrono::ChAparticle::ChAparticle(ChAparticle *this,ChAparticle *other)

{
  ChCollisionModelBullet *this_00;
  
  ChFrameMoving<double>::ChFrameMoving((ChFrameMoving<double> *)this,(ChFrameMoving<double> *)other)
  ;
  (this->super_ChContactable_1vars<6>).super_ChContactable.m_data.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ChContactable_1vars<6>).super_ChContactable.m_data.
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChParticleBase).super_ChFrameMoving<double>.super_ChFrame<double>._vptr_ChFrame =
       (_func_int **)&PTR__ChAparticle_00b35e68;
  (this->super_ChContactable_1vars<6>).super_ChContactable._vptr_ChContactable =
       (_func_int **)&PTR__ChAparticle_00b35f90;
  (this->super_ChContactable_1vars<6>).super_ChVariableTupleCarrier_1vars<6>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)&PTR__ChAparticle_00b36038;
  ChVariablesBodySharedMass::ChVariablesBodySharedMass(&this->variables);
  (this->UserForce).m_data[2] = 0.0;
  (this->UserTorque).m_data[0] = 0.0;
  (this->UserTorque).m_data[1] = 0.0;
  (this->UserTorque).m_data[2] = 0.0;
  (this->UserForce).m_data[0] = 0.0;
  (this->UserForce).m_data[1] = 0.0;
  (this->UserForce).m_data[2] = 0.0;
  (this->UserTorque).m_data[0] = 0.0;
  this_00 = (ChCollisionModelBullet *)::operator_new(0x68);
  collision::ChCollisionModelBullet::ChCollisionModelBullet(this_00);
  this->collision_model = (ChCollisionModel *)this_00;
  (*(this_00->super_ChCollisionModel)._vptr_ChCollisionModel[0x14])(this_00,other->collision_model);
  (*this->collision_model->_vptr_ChCollisionModel[0x16])
            (this->collision_model,&this->super_ChContactable_1vars<6>);
  this->container = other->container;
  if (other != this) {
    (this->UserForce).m_data[0] = (other->UserForce).m_data[0];
    (this->UserForce).m_data[1] = (other->UserForce).m_data[1];
    (this->UserForce).m_data[2] = (other->UserForce).m_data[2];
    (this->UserTorque).m_data[0] = (other->UserTorque).m_data[0];
    (this->UserTorque).m_data[1] = (other->UserTorque).m_data[1];
    (this->UserTorque).m_data[2] = (other->UserTorque).m_data[2];
  }
  ChVariablesBodySharedMass::operator=(&this->variables,&other->variables);
  return;
}

Assistant:

ChAparticle::ChAparticle(const ChAparticle& other) : ChParticleBase(other) {
    collision_model = new ChCollisionModelBullet;
    collision_model->AddCopyOfAnotherModel(other.collision_model);
    collision_model->SetContactable(this);

    container = other.container;
    UserForce = other.UserForce;
    UserTorque = other.UserTorque;
    variables = other.variables;
}